

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack11.cpp
# Opt level: O0

void __thiscall msgpack11::MsgPack::MsgPack(MsgPack *this,uint64_t value)

{
  shared_ptr<msgpack11::MsgPackUint64> local_28;
  uint64_t local_18;
  uint64_t value_local;
  MsgPack *this_local;
  
  local_18 = value;
  value_local = (uint64_t)this;
  std::make_shared<msgpack11::MsgPackUint64,unsigned_long&>((unsigned_long *)&local_28);
  std::shared_ptr<msgpack11::MsgPackValue>::shared_ptr<msgpack11::MsgPackUint64,void>
            (&this->m_ptr,&local_28);
  std::shared_ptr<msgpack11::MsgPackUint64>::~shared_ptr(&local_28);
  return;
}

Assistant:

MsgPack::MsgPack(uint64_t value)                   : m_ptr(make_shared<MsgPackUint64>(value)) {}